

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::MergeFrom
          (LayerNormalizationLayerParams *this,LayerNormalizationLayerParams *from)

{
  float fVar1;
  void *pvVar2;
  LogMessage *other;
  WeightParams *pWVar3;
  WeightParams *pWVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x10f4f);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  google::protobuf::RepeatedField<long>::MergeFrom(&this->normalizedshape_,&from->normalizedshape_);
  if ((from != (LayerNormalizationLayerParams *)&_LayerNormalizationLayerParams_default_instance_)
     && (from->gamma_ != (WeightParams *)0x0)) {
    pWVar3 = mutable_gamma(this);
    pWVar4 = from->gamma_;
    if (pWVar4 == (WeightParams *)0x0) {
      pWVar4 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar3,pWVar4);
  }
  if ((from != (LayerNormalizationLayerParams *)&_LayerNormalizationLayerParams_default_instance_)
     && (from->beta_ != (WeightParams *)0x0)) {
    pWVar3 = mutable_beta(this);
    pWVar4 = from->beta_;
    if (pWVar4 == (WeightParams *)0x0) {
      pWVar4 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar3,pWVar4);
  }
  fVar1 = from->eps_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->eps_ = fVar1;
  }
  return;
}

Assistant:

void LayerNormalizationLayerParams::MergeFrom(const LayerNormalizationLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LayerNormalizationLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  normalizedshape_.MergeFrom(from.normalizedshape_);
  if (from.has_gamma()) {
    mutable_gamma()->::CoreML::Specification::WeightParams::MergeFrom(from.gamma());
  }
  if (from.has_beta()) {
    mutable_beta()->::CoreML::Specification::WeightParams::MergeFrom(from.beta());
  }
  if (from.eps() != 0) {
    set_eps(from.eps());
  }
}